

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

void __thiscall libcalc::Tokenizer::parse(Tokenizer *this,string *expression)

{
  char symbol;
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  Token *pTVar4;
  size_type sVar5;
  Token *local_38;
  Token *t;
  
  pTVar4 = (Token *)operator_new(0x28);
  Token::Token(pTVar4);
  local_38 = pTVar4;
  std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
            (&this->tokens,&local_38);
  pcVar1 = (expression->_M_dataplus)._M_p;
  sVar2 = expression->_M_string_length;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    symbol = pcVar1[sVar5];
    bVar3 = Token::push(local_38,symbol);
    if (!bVar3) {
      pTVar4 = (Token *)operator_new(0x28);
      Token::Token(pTVar4,symbol);
      local_38 = pTVar4;
      std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                (&this->tokens,&local_38);
    }
  }
  return;
}

Assistant:

void Tokenizer::parse(std::string expression) {
  Token *t = new Token();
  tokens.push_back(t);

  for (char e : expression) {
    if (!t->push(e)) {
      t = new Token(e);
      tokens.push_back(t);
    }
  }
}